

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O1

Var Js::ProfilingHelpers::ProfiledNewScObjArraySpread_Jit
              (AuxArray<unsigned_int> *spreadIndices,Var callee,void *framePointer,
              ProfileId profileId,ProfileId arrayProfileId,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  long lVar2;
  Type TVar3;
  ProfileId profileId_00;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  JavascriptCallStackLayout *pJVar7;
  ScriptFunction *caller;
  Var pvVar8;
  Type __s;
  Arguments *args_00;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int in_stack_00000030;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  Var stackArgs [8];
  Arguments local_b0;
  Arguments local_a0;
  Arguments local_90;
  Arguments local_80;
  CallInfo local_70;
  CallInfo callInfo_local;
  ArgumentReader args;
  undefined1 auStack_48 [8];
  Arguments outArgs;
  
  __s = (Type)&uStack_f8;
  local_70 = callInfo;
  outArgs.Values._4_4_ = _profileId;
  if (callInfo._0_4_ != in_stack_00000030) {
    AssertCount = AssertCount + 1;
    uStack_100 = 0xb0492f;
    Throw::LogAssert();
    uStack_100 = 0xb0493f;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    uStack_100 = 0xb04967;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x226,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b04b33;
    *puVar6 = 0;
  }
  TVar3 = (Type)&stack0x00000038;
  callInfo_local = local_70;
  uStack_100 = 0xb04995;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_70);
  uStack_100 = 0xb0499d;
  pJVar7 = JavascriptCallStackLayout::FromFramePointer(framePointer);
  uStack_100 = 0xb049a5;
  caller = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)pJVar7);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    args_00 = &local_80;
    uVar10 = callInfo_local._0_4_;
    uVar11 = callInfo_local._4_4_;
  }
  else {
    scriptContext =
         (((((caller->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    local_b0.Info = callInfo_local;
    auStack_48._0_4_ = callInfo_local._0_4_ & 0xff000000;
    auStack_48._4_4_ = 0;
    outArgs.Info = (Type)0x0;
    uStack_100 = 0xb049f2;
    local_b0.Values = (Type)TVar3;
    uVar5 = JavascriptFunction::GetSpreadSize(&local_b0,spreadIndices,scriptContext);
    if (0xffffff < uVar5) {
      AssertCount = AssertCount + 1;
      uStack_100 = 0xb04a0e;
      Throw::LogAssert();
      uStack_100 = 0xb04a1e;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      uStack_100 = 0xb04a46;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x232,"(spreadSize == (((1 << 24) - 1) & spreadSize))",
                                  "spreadSize == (((1 << 24) - 1) & spreadSize)");
      if (!bVar4) {
LAB_00b04b33:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar9 = uVar5 & 0xffffff;
    auStack_48 = (undefined1  [8])((ulong)auStack_48 & 0xffffffffff000000 | (ulong)uVar9);
    if (uVar9 < 9) {
      outArgs.Info = (Type)&uStack_f8;
      uStack_f8 = 0;
      stackArgs[0] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      __s = (Type)&uStack_f8;
    }
    else {
      uStack_100 = 0xb04a91;
      ThreadContext::ProbeStack
                (scriptContext->threadContext,(ulong)uVar9 * 8 + 0xc00,scriptContext,(PVOID)0x0);
      uVar9 = (auStack_48._0_4_ & 0xffffff) * 8;
      lVar2 = -(ulong)(uVar9 + 0xf & 0xfffffff0);
      __s = (Type)((long)stackArgs + lVar2 + -8);
      outArgs.Info = __s;
      *(undefined8 *)((long)&uStack_100 + lVar2) = 0xb04ab9;
      memset((void *)__s,0,(ulong)uVar9);
    }
    local_a0.Info = callInfo_local;
    local_a0.Values = (Type)TVar3;
    *(undefined8 *)((long)__s + -8) = 0xb04b02;
    JavascriptFunction::SpreadArgs(&local_a0,(Arguments *)auStack_48,spreadIndices,scriptContext);
    args_00 = &local_90;
    uVar10 = auStack_48._0_4_;
    uVar11 = auStack_48._4_4_;
    TVar3 = outArgs.Info;
  }
  *(undefined4 *)&args_00->Info = uVar10;
  *(undefined4 *)&(args_00->Info).field_0x4 = uVar11;
  args_00->Values = (Type)TVar3;
  profileId_00 = outArgs.Values._4_2_;
  *(undefined8 *)((long)__s + -8) = 0xb04b24;
  pvVar8 = ProfiledNewScObjArray(callee,args_00,caller,profileId_00,arrayProfileId);
  return pvVar8;
}

Assistant:

Var ProfilingHelpers::ProfiledNewScObjArraySpread_Jit(
        const Js::AuxArray<uint32> *spreadIndices,
        const Var callee,
        void *const framePointer,
        const ProfileId profileId,
        const ProfileId arrayProfileId,
        CallInfo callInfo,
        ...)
    {
        ARGUMENTS(args, spreadIndices, callee, framePointer, profileId, arrayProfileId, callInfo);

        Js::ScriptFunction *function = UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        ScriptContext* scriptContext = function->GetScriptContext();

        JIT_HELPER_REENTRANT_HEADER(ProfiledNewScObjArraySpread);
        // GetSpreadSize ensures that spreadSize < 2^24
        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            Arguments outArgs(CallInfo(args.Info.Flags, 0), nullptr);
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);
            Assert(spreadSize == (((1 << 24) - 1) & spreadSize));
            // Allocate room on the stack for the spread args.
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);
            return
                ProfiledNewScObjArray(
                    callee,
                    outArgs,
                    function,
                    profileId,
                    arrayProfileId);
        }
        else
        {
            return
                ProfiledNewScObjArray(
                    callee,
                    args,
                    function,
                    profileId,
                    arrayProfileId);
        }
        JIT_HELPER_END(ProfiledNewScObjArraySpread);
    }